

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

int Mop_ManUnCreateGroups(Mop_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  int Entry;
  Vec_Int_t *p_00;
  int i;
  int i_00;
  
  iVar1 = p->vCubes->nSize;
  p->vCubes->nSize = 0;
  for (i = 0; i < vGroups->nSize; i = i + 1) {
    p_00 = Vec_WecEntry(vGroups,i);
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      Entry = Vec_IntEntry(p_00,i_00);
      if (Entry != -1) {
        Vec_IntPush(p->vCubes,Entry);
      }
    }
  }
  return iVar1 - p->vCubes->nSize;
}

Assistant:

static inline int Mop_ManUnCreateGroups( Mop_Man_t * p, Vec_Wec_t * vGroups )
{
    int i, c1, iCube1;
    int nBefore = Vec_IntSize(p->vCubes);
    Vec_Int_t * vGroup; 
    Vec_IntClear( p->vCubes );
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_IntForEachEntry( vGroup, iCube1, c1 )
            if ( iCube1 != -1 )
                Vec_IntPush( p->vCubes, iCube1 );
    return nBefore - Vec_IntSize(p->vCubes);
}